

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

NativePixmapFactory *
eglu::selectFactory<eglu::NativePixmapFactory>
          (FactoryRegistry<eglu::NativePixmapFactory> *registry,char *objectTypeName,
          char *cmdLineArg)

{
  ulong uVar1;
  bool bVar2;
  NativePixmapFactory *pNVar3;
  size_t sVar4;
  undefined8 uVar5;
  FactoryBase *this;
  char *pcVar6;
  NotSupportedError *pNVar7;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_112;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong local_70;
  size_t ndx;
  allocator<char> local_51;
  string local_50;
  NativePixmapFactory *local_30;
  NativePixmapFactory *factory;
  char *cmdLineArg_local;
  char *objectTypeName_local;
  FactoryRegistry<eglu::NativePixmapFactory> *registry_local;
  
  factory = (NativePixmapFactory *)cmdLineArg;
  cmdLineArg_local = objectTypeName;
  objectTypeName_local = (char *)registry;
  if (cmdLineArg == (char *)0x0) {
    bVar2 = tcu::FactoryRegistry<eglu::NativePixmapFactory>::empty(registry);
    if (bVar2) {
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"No factory supporting EGL \'",&local_179);
      std::operator+(&local_158,&local_178,cmdLineArg_local);
      std::operator+(&local_138,&local_158,"\' type");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      tcu::NotSupportedError::NotSupportedError
                (pNVar7,pcVar6,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x1ce);
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    registry_local =
         (FactoryRegistry<eglu::NativePixmapFactory> *)
         tcu::FactoryRegistry<eglu::NativePixmapFactory>::getDefaultFactory
                   ((FactoryRegistry<eglu::NativePixmapFactory> *)objectTypeName_local);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,cmdLineArg,&local_51);
    pNVar3 = tcu::FactoryRegistry<eglu::NativePixmapFactory>::getFactoryByName(registry,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    registry_local = (FactoryRegistry<eglu::NativePixmapFactory> *)pNVar3;
    if (pNVar3 == (NativePixmapFactory *)0x0) {
      local_30 = pNVar3;
      tcu::print("ERROR: Unknown or unsupported EGL %s type \'%s\'",cmdLineArg_local,factory);
      tcu::print("Available EGL %s types:\n",cmdLineArg_local);
      for (local_70 = 0; uVar1 = local_70,
          sVar4 = tcu::FactoryRegistry<eglu::NativePixmapFactory>::getFactoryCount
                            ((FactoryRegistry<eglu::NativePixmapFactory> *)objectTypeName_local),
          uVar1 < sVar4; local_70 = local_70 + 1) {
        pNVar3 = tcu::FactoryRegistry<eglu::NativePixmapFactory>::getFactoryByIndex
                           ((FactoryRegistry<eglu::NativePixmapFactory> *)objectTypeName_local,
                            local_70);
        uVar5 = (**(code **)(*(long *)pNVar3 + 0x10))();
        this = (FactoryBase *)
               tcu::FactoryRegistry<eglu::NativePixmapFactory>::getFactoryByIndex
                         ((FactoryRegistry<eglu::NativePixmapFactory> *)objectTypeName_local,
                          local_70);
        pcVar6 = tcu::FactoryBase::getDescription(this);
        tcu::print("  %s: %s\n",uVar5,pcVar6);
      }
      local_112 = 1;
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Unsupported or unknown EGL ",&local_111);
      std::operator+(&local_f0,&local_110,cmdLineArg_local);
      std::operator+(&local_d0,&local_f0," type \'");
      std::operator+(&local_b0,&local_d0,(char *)factory);
      std::operator+(&local_90,&local_b0,"\'");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      tcu::NotSupportedError::NotSupportedError
                (pNVar7,pcVar6,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x1c8);
      local_112 = 0;
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return (NativePixmapFactory *)registry_local;
}

Assistant:

static const Factory& selectFactory (const tcu::FactoryRegistry<Factory>& registry, const char* objectTypeName, const char* cmdLineArg)
{
	if (cmdLineArg)
	{
		const Factory* factory = registry.getFactoryByName(cmdLineArg);

		if (factory)
			return *factory;
		else
		{
			tcu::print("ERROR: Unknown or unsupported EGL %s type '%s'", objectTypeName, cmdLineArg);
			tcu::print("Available EGL %s types:\n", objectTypeName);
			for (size_t ndx = 0; ndx < registry.getFactoryCount(); ndx++)
				tcu::print("  %s: %s\n", registry.getFactoryByIndex(ndx)->getName(), registry.getFactoryByIndex(ndx)->getDescription());

			TCU_THROW(NotSupportedError, (string("Unsupported or unknown EGL ") + objectTypeName + " type '" + cmdLineArg + "'").c_str());
		}
	}
	else if (!registry.empty())
		return *registry.getDefaultFactory();
	else
		TCU_THROW(NotSupportedError, (string("No factory supporting EGL '") + objectTypeName + "' type").c_str());
}